

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

ArrayBuilder<kj::Own<capnp::PipelineHook>_> * __thiscall
kj::ArrayBuilder<kj::Own<capnp::PipelineHook>_>::operator=
          (ArrayBuilder<kj::Own<capnp::PipelineHook>_> *this,
          ArrayBuilder<kj::Own<capnp::PipelineHook>_> *other)

{
  Own<capnp::PipelineHook> *pOVar1;
  RemoveConst<kj::Own<capnp::PipelineHook>_> *pRVar2;
  Own<capnp::PipelineHook> *pOVar3;
  
  pOVar1 = this->ptr;
  if (pOVar1 != (Own<capnp::PipelineHook> *)0x0) {
    pRVar2 = this->pos;
    pOVar3 = this->endPtr;
    this->ptr = (Own<capnp::PipelineHook> *)0x0;
    this->pos = (RemoveConst<kj::Own<capnp::PipelineHook>_> *)0x0;
    this->endPtr = (Own<capnp::PipelineHook> *)0x0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,pOVar1,0x10,(long)pRVar2 - (long)pOVar1 >> 4,
               (long)pOVar3 - (long)pOVar1 >> 4,
               ArrayDisposer::Dispose_<kj::Own<capnp::PipelineHook>,_false>::destruct);
  }
  this->ptr = other->ptr;
  this->pos = other->pos;
  this->endPtr = other->endPtr;
  this->disposer = other->disposer;
  other->ptr = (Own<capnp::PipelineHook> *)0x0;
  other->pos = (RemoveConst<kj::Own<capnp::PipelineHook>_> *)0x0;
  other->endPtr = (Own<capnp::PipelineHook> *)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }